

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall ncnn::Extractor::Extractor(Extractor *this,Extractor *rhs)

{
  ExtractorPrivate *pEVar1;
  Allocator *pAVar2;
  Allocator *pAVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  int iVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  undefined3 uVar38;
  int iVar39;
  ExtractorPrivate *pEVar40;
  
  this->_vptr_Extractor = (_func_int **)&PTR__Extractor_0034e8b0;
  pEVar40 = (ExtractorPrivate *)operator_new(0x60);
  ExtractorPrivate::ExtractorPrivate(pEVar40,(Net *)0x0);
  this->d = pEVar40;
  pEVar1 = rhs->d;
  pEVar40->net = pEVar1->net;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
            (&pEVar40->blob_mats,&pEVar1->blob_mats);
  pEVar1 = rhs->d;
  pEVar40 = this->d;
  bVar37 = (pEVar1->opt).lightmode;
  uVar38 = *(undefined3 *)&(pEVar1->opt).field_0x1;
  iVar39 = (pEVar1->opt).num_threads;
  pAVar2 = (pEVar1->opt).blob_allocator;
  pAVar3 = (pEVar1->opt).workspace_allocator;
  iVar32 = (pEVar1->opt).openmp_blocktime;
  bVar33 = (pEVar1->opt).use_winograd_convolution;
  bVar34 = (pEVar1->opt).use_sgemm_convolution;
  bVar35 = (pEVar1->opt).use_int8_inference;
  bVar36 = (pEVar1->opt).use_vulkan_compute;
  bVar16 = (pEVar1->opt).use_bf16_storage;
  bVar17 = (pEVar1->opt).use_fp16_packed;
  bVar18 = (pEVar1->opt).use_fp16_storage;
  bVar19 = (pEVar1->opt).use_fp16_arithmetic;
  bVar20 = (pEVar1->opt).use_int8_packed;
  bVar21 = (pEVar1->opt).use_int8_storage;
  bVar22 = (pEVar1->opt).use_int8_arithmetic;
  bVar23 = (pEVar1->opt).use_packing_layout;
  bVar24 = (pEVar1->opt).use_shader_pack8;
  bVar25 = (pEVar1->opt).use_subgroup_basic;
  bVar26 = (pEVar1->opt).use_subgroup_vote;
  bVar27 = (pEVar1->opt).use_subgroup_ballot;
  bVar28 = (pEVar1->opt).use_subgroup_shuffle;
  bVar29 = (pEVar1->opt).use_image_storage;
  bVar30 = (pEVar1->opt).use_tensor_storage;
  bVar31 = (pEVar1->opt).use_weight_fp16_storage;
  bVar4 = (pEVar1->opt).use_local_pool_allocator;
  bVar5 = (pEVar1->opt).use_reserved_1;
  bVar6 = (pEVar1->opt).use_reserved_2;
  bVar7 = (pEVar1->opt).use_reserved_3;
  bVar8 = (pEVar1->opt).use_reserved_4;
  bVar9 = (pEVar1->opt).use_reserved_5;
  bVar10 = (pEVar1->opt).use_reserved_6;
  bVar11 = (pEVar1->opt).use_reserved_7;
  bVar12 = (pEVar1->opt).use_reserved_8;
  bVar13 = (pEVar1->opt).use_reserved_9;
  bVar14 = (pEVar1->opt).use_reserved_10;
  bVar15 = (pEVar1->opt).use_reserved_11;
  (pEVar40->opt).flush_denormals = (pEVar1->opt).flush_denormals;
  (pEVar40->opt).use_local_pool_allocator = bVar4;
  (pEVar40->opt).use_reserved_1 = bVar5;
  (pEVar40->opt).use_reserved_2 = bVar6;
  (pEVar40->opt).use_reserved_3 = bVar7;
  (pEVar40->opt).use_reserved_4 = bVar8;
  (pEVar40->opt).use_reserved_5 = bVar9;
  (pEVar40->opt).use_reserved_6 = bVar10;
  (pEVar40->opt).use_reserved_7 = bVar11;
  (pEVar40->opt).use_reserved_8 = bVar12;
  (pEVar40->opt).use_reserved_9 = bVar13;
  (pEVar40->opt).use_reserved_10 = bVar14;
  (pEVar40->opt).use_reserved_11 = bVar15;
  (pEVar40->opt).use_bf16_storage = bVar16;
  (pEVar40->opt).use_fp16_packed = bVar17;
  (pEVar40->opt).use_fp16_storage = bVar18;
  (pEVar40->opt).use_fp16_arithmetic = bVar19;
  (pEVar40->opt).use_int8_packed = bVar20;
  (pEVar40->opt).use_int8_storage = bVar21;
  (pEVar40->opt).use_int8_arithmetic = bVar22;
  (pEVar40->opt).use_packing_layout = bVar23;
  (pEVar40->opt).use_shader_pack8 = bVar24;
  (pEVar40->opt).use_subgroup_basic = bVar25;
  (pEVar40->opt).use_subgroup_vote = bVar26;
  (pEVar40->opt).use_subgroup_ballot = bVar27;
  (pEVar40->opt).use_subgroup_shuffle = bVar28;
  (pEVar40->opt).use_image_storage = bVar29;
  (pEVar40->opt).use_tensor_storage = bVar30;
  (pEVar40->opt).use_weight_fp16_storage = bVar31;
  (pEVar40->opt).workspace_allocator = pAVar3;
  (pEVar40->opt).openmp_blocktime = iVar32;
  (pEVar40->opt).use_winograd_convolution = bVar33;
  (pEVar40->opt).use_sgemm_convolution = bVar34;
  (pEVar40->opt).use_int8_inference = bVar35;
  (pEVar40->opt).use_vulkan_compute = bVar36;
  (pEVar40->opt).lightmode = bVar37;
  *(undefined3 *)&(pEVar40->opt).field_0x1 = uVar38;
  (pEVar40->opt).num_threads = iVar39;
  (pEVar40->opt).blob_allocator = pAVar2;
  return;
}

Assistant:

Extractor::Extractor(const Extractor& rhs)
    : d(new ExtractorPrivate(0))
{
    d->net = rhs.d->net;
    d->blob_mats = rhs.d->blob_mats;
    d->opt = rhs.d->opt;

#if NCNN_VULKAN
    d->local_blob_vkallocator = 0;
    d->local_staging_vkallocator = 0;

    d->blob_mats_gpu = rhs.d->blob_mats_gpu;
    d->blob_mats_gpu_image = rhs.d->blob_mats_gpu_image;
#endif // NCNN_VULKAN
}